

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::TexBindingCase::iterate(TexBindingCase *this)

{
  TestLog *pTVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  GLuint texture;
  allocator<char> local_139;
  string local_138;
  string local_118;
  CallLogWrapper gl;
  ScopedLogSection section_1;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  ResultCollector result;
  code *local_28;
  GLenum local_20;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138," // ERROR: ",(allocator<char> *)&local_118);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  gl.m_enableLog = true;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"initial",(allocator<char> *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Initial value",(allocator<char> *)&local_98);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_138,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  gls::StateQueryUtil::verifyStateInteger(&result,&gl,this->m_bindTarget,0,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"bind",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"After bind",(allocator<char> *)&local_b8);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_138,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  glu::CallLogWrapper::glGenTextures(&gl,1,&texture);
  glu::CallLogWrapper::glBindTexture(&gl,this->m_texTarget,texture);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_139);
    local_28 = glu::getErrorName;
    local_20 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_28);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_b8,&local_98);
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_138,&local_118,"bind texture");
    tcu::ResultCollector::fail(&result,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  gls::StateQueryUtil::verifyStateInteger
            (&result,&gl,this->m_bindTarget,texture,this->m_verifierType);
  glu::CallLogWrapper::glDeleteTextures(&gl,1,&texture);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"bind",(allocator<char> *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"After delete",(allocator<char> *)&local_98);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_138,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  gls::StateQueryUtil::verifyStateInteger(&result,&gl,this->m_bindTarget,0,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

TexBindingCase::IterateResult TexBindingCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial value");

		verifyStateInteger(result, gl, m_bindTarget, 0, m_verifierType);
	}

	// bind
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "bind", "After bind");

		glw::GLuint texture;

		gl.glGenTextures(1, &texture);
		gl.glBindTexture(m_texTarget, texture);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind texture");

		verifyStateInteger(result, gl, m_bindTarget, texture, m_verifierType);

		gl.glDeleteTextures(1, &texture);
	}

	// after delete
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "bind", "After delete");

		verifyStateInteger(result, gl, m_bindTarget, 0, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}